

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canfdtest.c
# Opt level: O3

void print_usage(char *prg)

{
  fprintf(_stderr,
          "%s - Full-duplex test program (DUT and host part).\nUsage: %s [options] [<can-interface>]\n\nOptions:\n         -b       (enable CAN FD Bit Rate Switch)\n         -d       (use CAN FD frames instead of classic CAN)\n         -e       (use 29-bit extended frame format instead of classic 11-bit one)\n         -f COUNT (number of frames in flight, default: %d)\n         -g       (generate messages)\n         -i ID    (CAN ID to use for frames to DUT (ping), default %x)\n         -l COUNT (test loop count)\n         -o ID    (CAN ID to use for frames to host (pong), default %x)\n         -s SIZE  (frame payload size in bytes)\n         -v       (low verbosity)\n         -vv      (high verbosity)\n         -x       (ignore other frames on bus)\n         -xx      (ignore locally generated and other frames on bus -- use for loopback testing)\n\nWith the option \'-g\' CAN messages are generated and checked\non <can-interface>, otherwise all messages received on the\n<can-interface> are sent back incrementing the CAN id and\nall data bytes. The program can be aborted with ^C.\n\nUsing \'can0\' as default CAN-interface.\n\nExamples:\n\ton DUT:\n%s -v can0\n\ton Host:\n%s -g -v can2\n"
          ,prg,prg,0x32,0x77,0x78,prg,prg);
  exit(1);
}

Assistant:

static void print_usage(char *prg)
{
	fprintf(stderr,
		"%s - Full-duplex test program (DUT and host part).\n"
		"Usage: %s [options] [<can-interface>]\n"
		"\n"
		"Options:\n"
		"         -b       (enable CAN FD Bit Rate Switch)\n"
		"         -d       (use CAN FD frames instead of classic CAN)\n"
		"         -e       (use 29-bit extended frame format instead of classic 11-bit one)\n"
		"         -f COUNT (number of frames in flight, default: %d)\n"
		"         -g       (generate messages)\n"
		"         -i ID    (CAN ID to use for frames to DUT (ping), default %x)\n"
		"         -l COUNT (test loop count)\n"
		"         -o ID    (CAN ID to use for frames to host (pong), default %x)\n"
		"         -s SIZE  (frame payload size in bytes)\n"
		"         -v       (low verbosity)\n"
		"         -vv      (high verbosity)\n"
		"         -x       (ignore other frames on bus)\n"
		"         -xx      (ignore locally generated and other frames on bus -- use for loopback testing)\n"
		"\n"
		"With the option '-g' CAN messages are generated and checked\n"
		"on <can-interface>, otherwise all messages received on the\n"
		"<can-interface> are sent back incrementing the CAN id and\n"
		"all data bytes. The program can be aborted with ^C.\n"
		"\n"
		"Using 'can0' as default CAN-interface.\n"
		"\n"
		"Examples:\n"
		"\ton DUT:\n"
		"%s -v can0\n"
		"\ton Host:\n"
		"%s -g -v can2\n",
		prg, prg, CAN_MSG_COUNT, CAN_MSG_ID_PING, CAN_MSG_ID_PONG, prg, prg);

	exit(1);
}